

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatMap.test.cpp
# Opt level: O2

ostream * operator<<(ostream *out,
                    FlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *map)

{
  pointer ppVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>
  *v;
  pointer custom;
  bool bVar5;
  
  std::operator<<(out,"{ ");
  ppVar1 = (map->vec_).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = 0;
  for (custom = (map->vec_).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; custom != ppVar1;
      custom = (pointer)&(custom->second).field_2) {
    bVar5 = lVar3 == 0;
    lVar3 = lVar3 + -1;
    pcVar4 = ", ";
    if (bVar5) {
      pcVar4 = "";
    }
    poVar2 = std::operator<<(out,pcVar4);
    poVar2 = std::operator<<(poVar2,"[");
    poVar2 = operator<<(poVar2,(CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)custom);
    poVar2 = std::operator<<(poVar2,"] -> ");
    operator<<(poVar2,(CustomType<int> *)&(custom->second)._M_string_length);
  }
  poVar2 = std::operator<<(out," }");
  return poVar2;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const FlatMap<Key, Value, Compare>& map) {
    out << "{ ";
    size_t i = 0;
    for (const auto& v : map) {
        out << (i++ == 0 ? "" : ", ") << "[" << v.first << "] -> " << v.second;
    }
    return out << " }";
}